

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

string * absl::StrCat<absl::Hex,char[4],std::__cxx11::string>
                   (AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,AlphaNum *e,Hex *args,
                   char (*args_1) [4],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  AlphaNum *in_RCX;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  string *in_RDI;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  string_view sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  AlphaNum *in_stack_fffffffffffffe10;
  Hex *in_stack_fffffffffffffe18;
  AlphaNum *in_stack_fffffffffffffe20;
  string_view *psVar2;
  AlphaNum local_188;
  AlphaNum local_158;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> in_stack_ffffffffffffff30
  ;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view *local_40;
  undefined8 local_38;
  AlphaNum *local_30;
  AlphaNum *local_28;
  AlphaNum *local_20;
  AlphaNum *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c0 = AlphaNum::Piece(in_RSI);
  local_b0 = AlphaNum::Piece(local_18);
  local_a0 = AlphaNum::Piece(local_20);
  local_90 = AlphaNum::Piece(local_28);
  local_80 = AlphaNum::Piece(local_30);
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  strings_internal::StringifySink::StringifySink((StringifySink *)0x1ae44c);
  AlphaNum::AlphaNum<absl::Hex,void>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (StringifySink *)in_stack_fffffffffffffe10);
  local_70 = AlphaNum::Piece((AlphaNum *)&stack0xffffffffffffff10);
  AlphaNum::AlphaNum(in_stack_fffffffffffffe10,(Nullable<const_char_*>)in_stack_fffffffffffffe08);
  local_60 = AlphaNum::Piece(&local_158);
  psVar2 = &local_50;
  AlphaNum::AlphaNum<std::allocator<char>>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  sVar1 = AlphaNum::Piece(&local_188);
  *psVar2 = sVar1;
  local_40 = &local_c0;
  local_38 = 8;
  strings_internal::CatPieces_abi_cxx11_(in_stack_ffffffffffffff30);
  strings_internal::StringifySink::~StringifySink((StringifySink *)0x1ae579);
  return in_RDI;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}